

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

void * mz_zip_reader_extract_file_to_heap
                 (mz_zip_archive *pZip,char *pFilename,size_t *pSize,mz_uint flags)

{
  mz_bool mVar1;
  undefined8 *in_RDX;
  mz_uint32 file_index;
  mz_uint32 *in_stack_00000038;
  mz_uint in_stack_00000044;
  char *in_stack_00000048;
  char *in_stack_00000050;
  mz_zip_archive *in_stack_00000058;
  mz_uint in_stack_00000454;
  size_t *in_stack_00000458;
  mz_uint in_stack_00000464;
  mz_zip_archive *in_stack_00000468;
  undefined8 local_8;
  
  mVar1 = mz_zip_reader_locate_file_v2
                    (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000044,
                     in_stack_00000038);
  if (mVar1 == 0) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = 0;
    }
    local_8 = (void *)0x0;
  }
  else {
    local_8 = mz_zip_reader_extract_to_heap
                        (in_stack_00000468,in_stack_00000464,in_stack_00000458,in_stack_00000454);
  }
  return local_8;
}

Assistant:

void *mz_zip_reader_extract_file_to_heap(mz_zip_archive *pZip,
                                         const char *pFilename, size_t *pSize,
                                         mz_uint flags) {
  mz_uint32 file_index;
  if (!mz_zip_reader_locate_file_v2(pZip, pFilename, NULL, flags,
                                    &file_index)) {
    if (pSize)
      *pSize = 0;
    return MZ_FALSE;
  }
  return mz_zip_reader_extract_to_heap(pZip, file_index, pSize, flags);
}